

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

_func_void_int * putty_signal(int sig,_func_void_int *func)

{
  int iVar1;
  _union_1457 _Var2;
  sigaction old;
  sigaction sa;
  _union_1457 local_140 [19];
  _union_1457 local_a8;
  sigset_t local_a0;
  undefined4 local_20;
  
  local_a8 = (_union_1457)func;
  iVar1 = sigemptyset(&local_a0);
  _Var2 = (_union_1457)0xffffffffffffffff;
  if (-1 < iVar1) {
    local_20 = 0x10000000;
    iVar1 = sigaction(sig,(sigaction *)&local_a8,(sigaction *)local_140);
    if (-1 < iVar1) {
      _Var2 = local_140[0];
    }
  }
  return (_func_void_int *)_Var2.sa_handler;
}

Assistant:

void (*putty_signal(int sig, void (*func)(int)))(int)
{
    struct sigaction sa;
    struct sigaction old;

    sa.sa_handler = func;
    if(sigemptyset(&sa.sa_mask) < 0)
        return SIG_ERR;
    sa.sa_flags = SA_RESTART;
    if(sigaction(sig, &sa, &old) < 0)
        return SIG_ERR;
    return old.sa_handler;
}